

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall libtorrent::dht::dht_tracker::start(dht_tracker *this,nodes_callback *f)

{
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *v1;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *v2;
  deadline_timer *this_00;
  dht_tracker *pdVar1;
  _Rb_tree_node_base *p_Var2;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  dht_tracker *local_80;
  _Rb_tree_node_base *local_78;
  undefined1 local_70 [8];
  undefined8 local_68;
  _Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
  local_60;
  __shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->m_running = true;
  local_70 = (undefined1  [8])((ulong)local_70 & 0xffffff0000000000);
  local_68 = &boost::system::detail::cat_holder<void>::system_category_instance;
  refresh_key(this,(error_code *)local_70);
  local_78 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header;
  v1 = &(this->m_state).nodes6;
  v2 = &(this->m_state).nodes;
  local_80 = this;
  for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pdVar1 = local_80, p_Var2 != local_78;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    local_70 = (undefined1  [8])0x3b9aca00;
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&p_Var2[0x16]._M_left,(duration *)local_70);
    local_98 = (element_type *)connection_timeout;
    a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::dht_tracker,void>
              (local_40,(__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
    ::std::
    _Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>
    ::
    _Bind<std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle_const&,std::_Placeholder<1>const&>
              ((_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>
                *)local_70,(offset_in_dht_tracker_to_subr *)&local_98,
               (shared_ptr<libtorrent::dht::dht_tracker> *)local_40,
               (listen_socket_handle *)(p_Var2 + 1),(_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&p_Var2[0x16]._M_left,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
                *)local_70);
    ::std::
    _Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
    ::~_Tuple_impl(&local_60);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    aux::listen_socket_handle::get_local_endpoint
              ((endpoint *)local_70,(listen_socket_handle *)(p_Var2 + 1));
    if (local_70._0_2_ == 2) {
      anon_unknown_20::concat
                ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *)local_70,v2,v1);
      dht::node::bootstrap
                ((node *)&p_Var2[1]._M_left,
                 (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *)local_70,f);
    }
    else {
      anon_unknown_20::concat
                ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *)local_70,v1,v2);
      dht::node::bootstrap
                ((node *)&p_Var2[1]._M_left,
                 (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *)local_70,f);
    }
    ::std::
    _Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~_Vector_base((_Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                     *)local_70);
  }
  this_00 = &local_80->m_refresh_timer;
  local_70 = (undefined1  [8])0x12a05f200;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(this_00,(duration *)local_70);
  ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::dht::dht_tracker,void>
            ((__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
  local_70 = (undefined1  [8])refresh_timeout;
  local_68 = (system_error_category *)0x0;
  local_60.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98;
  local_60.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_90[0]._M_pi;
  local_98 = (element_type *)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
            ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)this_00,
             (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)local_70);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_60.
                     super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                     .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>.
                     _M_head_impl.m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
             + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_90);
  dht_state::clear(&pdVar1->m_state);
  return;
}

Assistant:

void dht_tracker::start(find_data::nodes_callback const& f)
	{
		m_running = true;

		ADD_OUTSTANDING_ASYNC("dht_tracker::refresh_key");
		refresh_key({});

		for (auto& n : m_nodes)
		{
			ADD_OUTSTANDING_ASYNC("dht_tracker::connection_timeout");
			n.second.connection_timer.expires_after(seconds(1));
			n.second.connection_timer.async_wait(
				std::bind(&dht_tracker::connection_timeout, self(), n.first, _1));
			if (aux::is_v6(n.first.get_local_endpoint()))
				n.second.dht.bootstrap(concat(m_state.nodes6, m_state.nodes), f);
			else
				n.second.dht.bootstrap(concat(m_state.nodes, m_state.nodes6), f);
		}

		ADD_OUTSTANDING_ASYNC("dht_tracker::refresh_timeout");
		m_refresh_timer.expires_after(seconds(5));
		m_refresh_timer.async_wait(std::bind(&dht_tracker::refresh_timeout, self(), _1));

		m_state.clear();
	}